

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

_Bool is_calc_src_content_needed(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  uint64_t thresh_high;
  uint64_t thresh_low;
  uint64_t avg_64x64_blk_sad;
  _Bool do_calc_src_content;
  AV1_COMMON *cm;
  uint64_t curr_sb_sad;
  ulong local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  _Bool local_31;
  _Bool local_1;
  
  if ((in_RDI->svc).spatial_layer_id < (in_RDI->svc).number_spatial_layers + -1) {
    local_1 = true;
  }
  else {
    local_60 = get_sb_source_sad(in_RDI,in_EDX,in_ECX);
    if (local_60 == 0xffffffffffffffff) {
      local_1 = true;
    }
    else if (local_60 == 0) {
      *(undefined4 *)(in_RSI + 0x15d60) = 0;
      local_1 = false;
    }
    else {
      local_31 = true;
      if ((in_RDI->oxcf).speed < 9) {
        local_1 = true;
      }
      else {
        if ((in_RDI->common).width < (in_RDI->common).height) {
          local_54 = (in_RDI->common).width;
        }
        else {
          local_54 = (in_RDI->common).height;
        }
        if (local_54 < 0x168) {
          if (((in_RDI->common).seq_params)->sb_size == BLOCK_128X128) {
            local_60 = local_60 + 2 >> 2;
          }
          local_48 = 15000;
          local_50 = 40000;
          if ((in_RDI->sf).rt_sf.increase_source_sad_thresh != 0) {
            local_48 = 30000;
            local_50 = 80000;
          }
          if ((local_48 < local_60) && (local_60 < local_50)) {
            local_31 = false;
            *(undefined4 *)(in_RSI + 0x15d60) = 3;
          }
        }
        local_1 = local_31;
      }
    }
  }
  return local_1;
}

Assistant:

static inline bool is_calc_src_content_needed(AV1_COMP *cpi,
                                              MACROBLOCK *const x, int mi_row,
                                              int mi_col) {
  if (cpi->svc.spatial_layer_id < cpi->svc.number_spatial_layers - 1)
    return true;
  const uint64_t curr_sb_sad = get_sb_source_sad(cpi, mi_row, mi_col);
  if (curr_sb_sad == UINT64_MAX) return true;
  if (curr_sb_sad == 0) {
    x->content_state_sb.source_sad_nonrd = kZeroSad;
    return false;
  }
  AV1_COMMON *const cm = &cpi->common;
  bool do_calc_src_content = true;

  if (cpi->oxcf.speed < 9) return do_calc_src_content;

  // TODO(yunqing): Tune/validate the thresholds for 128x128 SB size.
  if (AOMMIN(cm->width, cm->height) < 360) {
    // Derive Average 64x64 block source SAD from SB source SAD
    const uint64_t avg_64x64_blk_sad =
        (cm->seq_params->sb_size == BLOCK_128X128) ? ((curr_sb_sad + 2) >> 2)
                                                   : curr_sb_sad;

    // The threshold is determined based on kLowSad and kHighSad threshold and
    // test results.
    uint64_t thresh_low = 15000;
    uint64_t thresh_high = 40000;

    if (cpi->sf.rt_sf.increase_source_sad_thresh) {
      thresh_low = thresh_low << 1;
      thresh_high = thresh_high << 1;
    }

    if (avg_64x64_blk_sad > thresh_low && avg_64x64_blk_sad < thresh_high) {
      do_calc_src_content = false;
      // Note: set x->content_state_sb.source_sad_rd as well if this is extended
      // to RTC rd path.
      x->content_state_sb.source_sad_nonrd = kMedSad;
    }
  }

  return do_calc_src_content;
}